

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O3

char * Kit_PlaFromIsop(Vec_Str_t *vStr,int nVars,Vec_Int_t *vCover)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  char cVar6;
  int iVar7;
  byte bVar8;
  long local_40;
  
  if (0 < vCover->nSize) {
    vStr->nSize = 0;
    local_40 = 0;
    do {
      if (0 < nVars) {
        iVar1 = vCover->pArray[local_40];
        bVar8 = 0;
        iVar7 = nVars;
        do {
          switch(iVar1 >> (bVar8 & 0x1f) & 3) {
          case 0:
            uVar3 = vStr->nSize;
            if (uVar3 == vStr->nCap) {
              if ((int)uVar3 < 0x10) {
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(0x10);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,0x10);
                }
                vStr->pArray = pcVar5;
                vStr->nCap = 0x10;
              }
              else {
                sVar4 = (ulong)uVar3 * 2;
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(sVar4);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,sVar4);
                }
                vStr->pArray = pcVar5;
                vStr->nCap = (int)sVar4;
              }
            }
            else {
              pcVar5 = vStr->pArray;
            }
            cVar6 = '-';
            break;
          case 1:
            uVar3 = vStr->nSize;
            if (uVar3 == vStr->nCap) {
              if ((int)uVar3 < 0x10) {
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(0x10);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,0x10);
                }
                vStr->pArray = pcVar5;
                vStr->nCap = 0x10;
              }
              else {
                sVar4 = (ulong)uVar3 * 2;
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(sVar4);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,sVar4);
                }
                vStr->pArray = pcVar5;
                vStr->nCap = (int)sVar4;
              }
            }
            else {
              pcVar5 = vStr->pArray;
            }
            cVar6 = '0';
            break;
          case 2:
            uVar3 = vStr->nSize;
            if (uVar3 == vStr->nCap) {
              if ((int)uVar3 < 0x10) {
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(0x10);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,0x10);
                }
                vStr->pArray = pcVar5;
                vStr->nCap = 0x10;
              }
              else {
                sVar4 = (ulong)uVar3 * 2;
                if (vStr->pArray == (char *)0x0) {
                  pcVar5 = (char *)malloc(sVar4);
                }
                else {
                  pcVar5 = (char *)realloc(vStr->pArray,sVar4);
                }
                vStr->pArray = pcVar5;
                vStr->nCap = (int)sVar4;
              }
            }
            else {
              pcVar5 = vStr->pArray;
            }
            cVar6 = '1';
            break;
          case 3:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                          ,0x181,"char *Kit_PlaFromIsop(Vec_Str_t *, int, Vec_Int_t *)");
          }
          iVar2 = vStr->nSize;
          vStr->nSize = iVar2 + 1;
          pcVar5[iVar2] = cVar6;
          bVar8 = bVar8 + 2;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      uVar3 = vStr->nSize;
      if (uVar3 == vStr->nCap) {
        if ((int)uVar3 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar3 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar4);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar5 = vStr->pArray;
      }
      iVar1 = vStr->nSize;
      vStr->nSize = iVar1 + 1;
      pcVar5[iVar1] = ' ';
      uVar3 = vStr->nSize;
      if (uVar3 == vStr->nCap) {
        if ((int)uVar3 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar3 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar4);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar5 = vStr->pArray;
      }
      iVar1 = vStr->nSize;
      vStr->nSize = iVar1 + 1;
      pcVar5[iVar1] = '1';
      uVar3 = vStr->nSize;
      if (uVar3 == vStr->nCap) {
        if ((int)uVar3 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = 0x10;
        }
        else {
          sVar4 = (ulong)uVar3 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar4);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar4);
          }
          vStr->pArray = pcVar5;
          vStr->nCap = (int)sVar4;
        }
      }
      else {
        pcVar5 = vStr->pArray;
      }
      iVar1 = vStr->nSize;
      vStr->nSize = iVar1 + 1;
      pcVar5[iVar1] = '\n';
      local_40 = local_40 + 1;
    } while (local_40 < vCover->nSize);
    uVar3 = vStr->nSize;
    if (uVar3 == vStr->nCap) {
      if ((int)uVar3 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(vStr->pArray,0x10);
        }
        vStr->pArray = pcVar5;
        vStr->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar3 * 2;
        if (vStr->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar4);
        }
        else {
          pcVar5 = (char *)realloc(vStr->pArray,sVar4);
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar4;
      }
    }
    else {
      pcVar5 = vStr->pArray;
    }
    iVar1 = vStr->nSize;
    vStr->nSize = iVar1 + 1;
    pcVar5[iVar1] = '\0';
    return vStr->pArray;
  }
  __assert_fail("Vec_IntSize(vCover) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                ,0x171,"char *Kit_PlaFromIsop(Vec_Str_t *, int, Vec_Int_t *)");
}

Assistant:

char * Kit_PlaFromIsop( Vec_Str_t * vStr, int nVars, Vec_Int_t * vCover )
{
    int i, k, Entry, Literal;
    assert( Vec_IntSize(vCover) > 0 );
    if ( Vec_IntSize(vCover) == 0 )
        return NULL;
    Vec_StrClear( vStr );
    Vec_IntForEachEntry( vCover, Entry, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 )
                Vec_StrPush( vStr, '0' );
            else if ( Literal == 2 )
                Vec_StrPush( vStr, '1' );
            else if ( Literal == 0 )
                Vec_StrPush( vStr, '-' );
            else
                assert( 0 );
        }
        Vec_StrPush( vStr, ' ' );
        Vec_StrPush( vStr, '1' );
        Vec_StrPush( vStr, '\n' );
    }
    Vec_StrPush( vStr, '\0' );
    return Vec_StrArray( vStr );
}